

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3ColumnlistCopy(char **pp,char **ppPoslist)

{
  char *__dest;
  int iVar1;
  char *p;
  int n;
  char c;
  char *pEnd;
  char **ppPoslist_local;
  char **pp_local;
  
  p._7_1_ = 0;
  _n = (byte *)*ppPoslist;
  while (((int)(char)(*_n | p._7_1_) & 0xfeU) != 0) {
    p._7_1_ = *_n & 0x80;
    _n = _n + 1;
  }
  if (pp != (char **)0x0) {
    iVar1 = (int)_n - (int)*ppPoslist;
    __dest = *pp;
    memcpy(__dest,*ppPoslist,(long)iVar1);
    *pp = __dest + iVar1;
  }
  *ppPoslist = (char *)_n;
  return;
}

Assistant:

static void fts3ColumnlistCopy(char **pp, char **ppPoslist){
  char *pEnd = *ppPoslist;
  char c = 0;

  /* A column-list is terminated by either a 0x01 or 0x00 byte that is
  ** not part of a multi-byte varint.
  */
  while( 0xFE & (*pEnd | c) ){
    c = *pEnd++ & 0x80;
    testcase( c!=0 && ((*pEnd)&0xfe)==0 );
  }
  if( pp ){
    int n = (int)(pEnd - *ppPoslist);
    char *p = *pp;
    memcpy(p, *ppPoslist, n);
    p += n;
    *pp = p;
  }
  *ppPoslist = pEnd;
}